

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O1

void __thiscall mnf::Manifold::~Manifold(Manifold *this)

{
  pointer pcVar1;
  
  this->_vptr_Manifold = (_func_int **)&PTR__Manifold_001417c0;
  pcVar1 = (this->name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name_).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_ValidManifold).flag_ = -0x1033c4d6;
  RefCounter::~RefCounter(&this->super_RefCounter);
  return;
}

Assistant:

Manifold::~Manifold() {}